

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O2

void __thiscall Omega_h::Parents::~Parents(Parents *this)

{
  Write<signed_char>::~Write(&(this->codes).write_);
  Write<int>::~Write((Write<int> *)this);
  return;
}

Assistant:

OMEGA_H_INLINE Parents() {}